

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O3

array_impl<std::shared_ptr<iclient>,_std::shared_ptr<user>,_std::shared_ptr<timer>_> * __thiscall
boost::ext::di::v1_3_0::providers::stack_over_heap::
get<boost::ext::di::v1_3_0::core::array_impl<std::shared_ptr<iclient>,std::shared_ptr<user>,std::shared_ptr<timer>>,boost::ext::di::v1_3_0::core::successful::wrapper<std::shared_ptr<user>,boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,user,std::shared_ptr<user>&>>,boost::ext::di::v1_3_0::core::successful::wrapper<std::shared_ptr<timer>,boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,timer*>>>
          (array_impl<std::shared_ptr<iclient>,_std::shared_ptr<user>,_std::shared_ptr<timer>_>
           *__return_storage_ptr__,stack_over_heap *this,direct *param_1,stack *param_2,
          wrapper<std::shared_ptr<user>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_user,_std::shared_ptr<user>_&>_>
          *args,wrapper<std::shared_ptr<timer>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_timer_*>_>
                *args_1)

{
  shared_ptr<user> *psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  psVar1 = (args->wrapper_).object;
  peVar2 = &((psVar1->super___shared_ptr<user,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_iclient;
  p_Var3 = (psVar1->super___shared_ptr<user,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  __p = &((args_1->wrapper_).object)->super_iclient;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<timer*>(&_Stack_20,(timer *)__p);
  __return_storage_ptr__->array[0].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  __return_storage_ptr__->array[0].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  __return_storage_ptr__->array[1].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       __p;
  __return_storage_ptr__->array[1].super___shared_ptr<iclient,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_20._M_pi;
  return __return_storage_ptr__;
}

Assistant:

auto get(const type_traits::direct&, const type_traits::stack&, TArgs&&... args) const {
    return T(static_cast<TArgs&&>(args)...);
  }